

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O2

ptr<resp_msg> __thiscall nuraft::raft_server::handle_vote_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  uint uVar2;
  pointer psVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint *puVar6;
  _func_int **pp_Var7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  long *plVar11;
  srv_role _role;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  long *plVar13;
  bool bVar14;
  bool bVar15;
  shared_ptr<nuraft::resp_msg> sVar16;
  undefined1 auVar17 [16];
  ptr<resp_msg> pVar18;
  string local_b0;
  uint local_8c;
  ptr<cluster_config> c_conf;
  undefined4 local_68;
  undefined4 uStack_64;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  pointer local_58;
  raft_server *local_50;
  undefined8 local_48;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  size_t local_38;
  
  psVar3 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (psVar3 != (pointer)0x0) {
    iVar9 = (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    if (3 < iVar9) {
      psVar3 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      srv_role_to_string_abi_cxx11_
                ((string *)&c_conf,
                 (nuraft *)
                 (ulong)*(uint *)&req[8].log_entries_.
                                  super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,_role);
      uVar8._4_4_ = c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._4_4_;
      uVar8._0_4_ = (int32)c_conf.
                           super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
      uVar2 = *(uint *)(in_RDX + 0x14);
      local_38 = *(size_t *)(in_RDX + 0x20);
      (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x20))(&local_68);
      uVar4 = *(undefined8 *)CONCAT44(uStack_64,local_68);
      local_40.__d.__r = *(duration *)(in_RDX + 0x28);
      local_8c = uVar2;
      local_58 = psVar3;
      local_50 = this;
      local_48 = uVar8;
      lVar10 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      msg_if_given_abi_cxx11_
                (&local_b0,
                 "[VOTE REQ] my role %s, from peer %d, log term: req %lu / mine %lu\nlast idx: req %lu / mine %lu, term: req %lu / mine %lu\npriority: target %d / mine %d, voted_for %d"
                 ,local_48,(ulong)local_8c,local_38,uVar4,local_40.__d.__r,lVar10 + -1,
                 *(undefined8 *)(in_RDX + 8),req[9].super_msg_base._vptr_msg_base[1],
                 (ulong)*(uint *)&(req->log_entries_).
                                  super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                 (ulong)*(uint *)((long)&(req->log_entries_).
                                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4),
                 (ulong)*(uint *)(req[9].super_msg_base._vptr_msg_base + 2));
      (*(code *)(local_58->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(local_58,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                        ,"handle_vote_req",0x122,&local_b0);
      this = local_50;
      std::__cxx11::string::~string((string *)&local_b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      std::__cxx11::string::~string((string *)&c_conf);
    }
  }
  local_b0._M_dataplus._M_p = (pointer)req[9].super_msg_base._vptr_msg_base[1];
  c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 2;
  local_68 = *(undefined4 *)(in_RDX + 0x14);
  sVar16 = std::make_shared<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int>
                     ((unsigned_long *)this,(msg_type *)&local_b0,(int *)&c_conf,
                      (int *)&req->log_entries_);
  uVar5 = *(ulong *)(in_RDX + 0x20);
  plVar13 = *(long **)&req[9].super_msg_base.type_;
  (**(code **)(*plVar13 + 0x20))
            (&local_b0,plVar13,
             sVar16.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._M_pi);
  if (*(ulong *)local_b0._M_dataplus._M_p < uVar5) {
    bVar15 = false;
  }
  else {
    lVar10 = *(long *)(in_RDX + 0x20);
    (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x20))(&c_conf);
    bVar15 = true;
    if (lVar10 == *(long *)CONCAT44(c_conf.
                                    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._4_4_,
                                    (int32)c_conf.
                                           super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)) {
      lVar10 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      bVar15 = *(ulong *)(in_RDX + 0x28) < lVar10 - 1U;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
  bVar14 = false;
  if (((!bVar15) &&
      (bVar14 = false, *(_func_int **)(in_RDX + 8) == req[9].super_msg_base._vptr_msg_base[1])) &&
     (bVar14 = true, *(int *)(req[9].super_msg_base._vptr_msg_base + 2) != *(int *)(in_RDX + 0x14)))
  {
    bVar14 = *(int *)(req[9].super_msg_base._vptr_msg_base + 2) == -1;
  }
  bVar15 = *(long *)(in_RDX + 0x40) != *(long *)(in_RDX + 0x38);
  _Var12._M_pi = extraout_RDX;
  if ((bVar15) &&
     (psVar3 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage, psVar3 != (pointer)0x0)) {
    iVar9 = (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var12._M_pi = extraout_RDX_00;
    if (3 < iVar9) {
      psVar3 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_(&local_b0,"[VOTE REQ] force vote request, will ignore priority");
      (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar3,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                        ,"handle_vote_req",0x137,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      _Var12._M_pi = extraout_RDX_01;
    }
  }
  if (((ulong)req[2].log_entries_.
              super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) != 0) {
    psVar3 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    bVar15 = true;
    if (psVar3 != (pointer)0x0) {
      iVar9 = (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var12._M_pi = extraout_RDX_02;
      if (3 < iVar9) {
        psVar3 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  (&local_b0,
                   "[VOTE REQ] this server is catching-up with leader, will ignore priority");
        (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_vote_req",0x13c,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        _Var12._M_pi = extraout_RDX_03;
      }
    }
  }
  if (bVar14) {
    get_config((raft_server *)&c_conf);
    plVar11 = (long *)(CONCAT44(c_conf.
                                super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr._4_4_,
                                (int32)c_conf.
                                       super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr) + 0x38);
    plVar13 = plVar11;
    do {
      plVar13 = (long *)*plVar13;
      if (plVar13 == plVar11) {
        psVar3 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar3 != (pointer)0x0) {
          iVar9 = (*(code *)(psVar3->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
          ;
          if (3 < iVar9) {
            psVar3 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      (&local_b0,"decision: O (grant), voted_for %d, term %lu",
                       (ulong)*(uint *)(in_RDX + 0x14),this->_vptr_raft_server[1]);
            (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar3,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"handle_vote_req",0x157,&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
          }
        }
        pp_Var7 = this->_vptr_raft_server;
        auVar17 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
        pp_Var7[4] = auVar17._0_8_;
        *(undefined1 *)(pp_Var7 + 6) = 1;
        LOCK();
        pp_Var7 = req[9].super_msg_base._vptr_msg_base + 2;
        uVar1 = *(undefined4 *)pp_Var7;
        *(undefined4 *)pp_Var7 = *(undefined4 *)(in_RDX + 0x14);
        UNLOCK();
        plVar13 = (long *)**(undefined8 **)&req[4].super_msg_base.dst_;
        (**(code **)(*plVar13 + 0x20))
                  (plVar13,req[9].super_msg_base._vptr_msg_base,auVar17._8_8_,uVar1);
        goto LAB_001172e6;
      }
    } while (((bVar15) || (puVar6 = (uint *)plVar13[2], *puVar6 != *(uint *)(in_RDX + 0x14))) ||
            ((puVar6[0x13] == 0 ||
             (*(int *)&(req->log_entries_).
                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish <= (int)puVar6[0x13]))));
    psVar3 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar3 != (pointer)0x0) {
      iVar9 = (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      if (3 < iVar9) {
        psVar3 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  (&local_b0,"I (%d) could vote for peer %d, but priority %d is lower than %d",
                   (ulong)*(uint *)&(req->log_entries_).
                                    super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,(ulong)*puVar6,
                   (ulong)puVar6[0x13],
                   (ulong)*(uint *)&(req->log_entries_).
                                    super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
        (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_vote_req",0x150,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      psVar3 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (psVar3 != (pointer)0x0) {
        iVar9 = (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
        if (3 < iVar9) {
          psVar3 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          msg_if_given_abi_cxx11_(&local_b0,"decision: X (deny)\n");
          (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar3,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_vote_req",0x151,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
        }
      }
    }
LAB_001172e6:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    _Var12._M_pi = extraout_RDX_06;
  }
  else {
    psVar3 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar3 != (pointer)0x0) {
      iVar9 = (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var12._M_pi = extraout_RDX_04;
      if (3 < iVar9) {
        psVar3 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_(&local_b0,"decision: X (deny), term %lu",this->_vptr_raft_server[1])
        ;
        (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_vote_req",0x15c,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        _Var12._M_pi = extraout_RDX_05;
      }
    }
  }
  pVar18.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  pVar18.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar18.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_vote_req(req_msg& req) {
    p_in("[VOTE REQ] my role %s, from peer %d, "
         "log term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "last idx: req %" PRIu64 " / mine %" PRIu64
         ", term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "priority: target %d / mine %d, voted_for %d",
         srv_role_to_string(role_).c_str(),
         req.get_src(), req.get_last_log_term(), log_store_->last_entry()->get_term(),
         req.get_last_log_idx(), log_store_->next_slot()-1,
         req.get_term(), state_->get_term(),
         target_priority_, my_priority_, state_->get_voted_for());

    ptr<resp_msg> resp( cs_new<resp_msg>
                        ( state_->get_term(),
                          msg_type::request_vote_response,
                          id_,
                          req.get_src() ) );

    bool log_okay =
        req.get_last_log_term() > log_store_->last_entry()->get_term() ||
        ( req.get_last_log_term() == log_store_->last_entry()->get_term() &&
          log_store_->next_slot() - 1 <= req.get_last_log_idx() );

    bool grant =
        req.get_term() == state_->get_term() &&
        log_okay &&
        ( state_->get_voted_for() == req.get_src() ||
          state_->get_voted_for() == -1 );

    bool ignore_priority = false;
    if (req.log_entries().size() > 0) {
        p_in("[VOTE REQ] force vote request, will ignore priority");
        ignore_priority = true;
    }
    if (catching_up_) {
        p_in("[VOTE REQ] this server is catching-up with leader, "
             "will ignore priority");
        ignore_priority = true;
    }

    if (grant) {
        ptr<cluster_config> c_conf = get_config();
        for (auto& entry: c_conf->get_servers()) {
            srv_config* s_conf = entry.get();
            if ( !ignore_priority &&
                 s_conf->get_id() == req.get_src() &&
                 s_conf->get_priority() &&
                 s_conf->get_priority() < target_priority_ ) {
                // NOTE:
                //   If zero-priority member initiates leader election,
                //   that is intentionally triggered by the flag in
                //   `raft_params`. In such case, we don't check the
                //   priority.
                p_in("I (%d) could vote for peer %d, "
                     "but priority %d is lower than %d",
                     id_, s_conf->get_id(),
                     s_conf->get_priority(), target_priority_);
                p_in("decision: X (deny)\n");
                return resp;
            }
        }

        p_in("decision: O (grant), voted_for %d, term %" PRIu64,
             req.get_src(), resp->get_term());
        resp->accept(log_store_->next_slot());
        state_->set_voted_for(req.get_src());
        ctx_->state_mgr_->save_state(*state_);
    } else {
        p_in("decision: X (deny), term %" PRIu64, resp->get_term());
    }

    return resp;
}